

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall
Minisat::Solver::analyze
          (Solver *this,CRef confl,vec<Minisat::Lit,_int> *out_learnt,int *out_btlevel)

{
  VMap<char> *this_00;
  bool bVar1;
  int iVar2;
  CRef CVar3;
  int iVar4;
  int iVar5;
  anon_struct_4_5_613047fb_for_header *c;
  char *pcVar6;
  long lVar7;
  uint *puVar8;
  Lit *pLVar9;
  Lit *pLVar10;
  int k;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  Lit q;
  uint local_50;
  
  vec<Minisat::Lit,_int>::push(out_learnt);
  uVar14 = (ulong)((this->trail).sz - 1);
  this_00 = &this->seen;
  local_50 = 0xfffffffe;
  iVar11 = 0;
  do {
    if (confl == 0xffffffff) {
      __assert_fail("confl != CRef_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                    ,0x133,"void Minisat::Solver::analyze(CRef, vec<Lit> &, int &)");
    }
    c = (anon_struct_4_5_613047fb_for_header *)
        RegionAllocator<unsigned_int>::operator[](&(this->ca).ra,confl);
    if (((uint)*c & 4) != 0) {
      claBumpActivity(this,(Clause *)c);
    }
    for (uVar13 = (ulong)(local_50 != 0xfffffffe); uVar13 < (uint)*c >> 5; uVar13 = uVar13 + 1) {
      q.x = *(int *)(c + uVar13 + 1);
      pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,q.x >> 1)
      ;
      if ((*pcVar6 == '\0') && (iVar2 = level(this,q.x >> 1), 0 < iVar2)) {
        varBumpActivity(this,q.x >> 1);
        pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            q.x >> 1);
        *pcVar6 = '\x01';
        iVar2 = level(this,q.x >> 1);
        if (iVar2 < (this->trail_lim).sz) {
          vec<Minisat::Lit,_int>::push(out_learnt,&q);
        }
        else {
          iVar11 = iVar11 + 1;
        }
      }
    }
    uVar14 = (long)(int)uVar14;
    do {
      uVar13 = uVar14;
      uVar14 = uVar13 - 1;
      pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          (this->trail).data[uVar13].x >> 1);
    } while (*pcVar6 == '\0');
    local_50 = (this->trail).data[uVar13].x;
    confl = reason(this,(int)local_50 >> 1);
    pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                        (int)local_50 >> 1);
    *pcVar6 = '\0';
    bVar1 = 1 < iVar11;
    iVar11 = iVar11 + -1;
  } while (bVar1);
  out_learnt->data->x = local_50 ^ 1;
  vec<Minisat::Lit,_int>::copyTo(out_learnt,&this->analyze_toclear);
  if (this->ccmin_mode == 2) {
    uVar12 = 1;
    for (uVar14 = 1; lVar7 = (long)out_learnt->sz, (long)uVar14 < lVar7; uVar14 = uVar14 + 1) {
      CVar3 = reason(this,out_learnt->data[uVar14].x >> 1);
      if ((CVar3 == 0xffffffff) ||
         (bVar1 = litRedundant(this,(Lit)out_learnt->data[uVar14].x), !bVar1)) {
        lVar7 = (long)(int)uVar12;
        uVar12 = uVar12 + 1;
        out_learnt->data[lVar7].x = out_learnt->data[uVar14].x;
      }
    }
  }
  else if (this->ccmin_mode == 1) {
    uVar12 = 1;
    for (uVar14 = 1; lVar7 = (long)out_learnt->sz, (long)uVar14 < lVar7; uVar14 = uVar14 + 1) {
      CVar3 = reason(this,out_learnt->data[uVar14].x >> 1);
      pLVar9 = out_learnt->data;
      pLVar10 = pLVar9 + uVar14;
      if (CVar3 == 0xffffffff) {
LAB_0010c17a:
        lVar7 = (long)(int)uVar12;
        uVar12 = uVar12 + 1;
        pLVar9[lVar7].x = pLVar10->x;
      }
      else {
        CVar3 = reason(this,pLVar10->x >> 1);
        puVar8 = RegionAllocator<unsigned_int>::operator[](&(this->ca).ra,CVar3);
        for (uVar13 = 1; uVar13 < *puVar8 >> 5; uVar13 = uVar13 + 1) {
          pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              (int)puVar8[uVar13 + 1] >> 1);
          if ((*pcVar6 == '\0') && (iVar11 = level(this,(int)puVar8[uVar13 + 1] >> 1), 0 < iVar11))
          {
            pLVar9 = out_learnt->data;
            pLVar10 = pLVar9 + uVar14;
            goto LAB_0010c17a;
          }
        }
      }
    }
  }
  else {
    uVar12 = out_learnt->sz;
    lVar7 = (long)(int)uVar12;
    uVar14 = (ulong)uVar12;
  }
  this->max_literals = this->max_literals + lVar7;
  vec<Minisat::Lit,_int>::shrink(out_learnt,(int)uVar14 - uVar12);
  uVar14 = (ulong)out_learnt->sz;
  this->tot_literals = this->tot_literals + uVar14;
  iVar11 = 0;
  if (uVar14 != 1) {
    lVar7 = 2;
    iVar11 = 1;
    while( true ) {
      pLVar10 = out_learnt->data;
      if ((int)uVar14 <= lVar7) break;
      iVar4 = level(this,pLVar10[lVar7].x >> 1);
      iVar5 = level(this,out_learnt->data[iVar11].x >> 1);
      iVar2 = (int)lVar7;
      if (iVar4 <= iVar5) {
        iVar2 = iVar11;
      }
      lVar7 = lVar7 + 1;
      uVar14 = (ulong)(uint)out_learnt->sz;
      iVar11 = iVar2;
    }
    iVar2 = pLVar10[iVar11].x;
    pLVar10[iVar11].x = pLVar10[1].x;
    pLVar10[1].x = iVar2;
    iVar11 = level(this,iVar2 >> 1);
  }
  *out_btlevel = iVar11;
  for (lVar7 = 0; lVar7 < (this->analyze_toclear).sz; lVar7 = lVar7 + 1) {
    pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                        (this->analyze_toclear).data[lVar7].x >> 1);
    *pcVar6 = '\0';
  }
  return;
}

Assistant:

void Solver::analyze(CRef confl, vec<Lit>& out_learnt, int& out_btlevel)
{
    int pathC = 0;
    Lit p     = lit_Undef;

    // Generate conflict clause:
    //
    out_learnt.push();      // (leave room for the asserting literal)
    int index   = trail.size() - 1;

    do{
        assert(confl != CRef_Undef); // (otherwise should be UIP)
        Clause& c = ca[confl];

        if (c.learnt())
            claBumpActivity(c);

        for (int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++){
            Lit q = c[j];

            if (!seen[var(q)] && level(var(q)) > 0){
                varBumpActivity(var(q));
                seen[var(q)] = 1;
                if (level(var(q)) >= decisionLevel())
                    pathC++;
                else
                    out_learnt.push(q);
            }
        }
        
        // Select next clause to look at:
        while (!seen[var(trail[index--])]);
        p     = trail[index+1];
        confl = reason(var(p));
        seen[var(p)] = 0;
        pathC--;

    }while (pathC > 0);
    out_learnt[0] = ~p;

    // Simplify conflict clause:
    //
    int i, j;
    out_learnt.copyTo(analyze_toclear);
    if (ccmin_mode == 2){
        for (i = j = 1; i < out_learnt.size(); i++)
            if (reason(var(out_learnt[i])) == CRef_Undef || !litRedundant(out_learnt[i]))
                out_learnt[j++] = out_learnt[i];
        
    }else if (ccmin_mode == 1){
        for (i = j = 1; i < out_learnt.size(); i++){
            Var x = var(out_learnt[i]);

            if (reason(x) == CRef_Undef)
                out_learnt[j++] = out_learnt[i];
            else{
                Clause& c = ca[reason(var(out_learnt[i]))];
                for (int k = 1; k < c.size(); k++)
                    if (!seen[var(c[k])] && level(var(c[k])) > 0){
                        out_learnt[j++] = out_learnt[i];
                        break; }
            }
        }
    }else
        i = j = out_learnt.size();

    max_literals += out_learnt.size();
    out_learnt.shrink(i - j);
    tot_literals += out_learnt.size();

    // Find correct backtrack level:
    //
    if (out_learnt.size() == 1)
        out_btlevel = 0;
    else{
        int max_i = 1;
        // Find the first literal assigned at the next-highest level:
        for (int i = 2; i < out_learnt.size(); i++)
            if (level(var(out_learnt[i])) > level(var(out_learnt[max_i])))
                max_i = i;
        // Swap-in this literal at index 1:
        Lit p             = out_learnt[max_i];
        out_learnt[max_i] = out_learnt[1];
        out_learnt[1]     = p;
        out_btlevel       = level(var(p));
    }

    for (int j = 0; j < analyze_toclear.size(); j++) seen[var(analyze_toclear[j])] = 0;    // ('seen[]' is now cleared)
}